

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallDirectoryGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallDirectoryGenerator *this,string *config)

{
  pointer pcVar1;
  string *psVar2;
  undefined1 local_60 [8];
  cmGeneratorExpression ge;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_38;
  
  local_48 = (element_type *)0x0;
  uStack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&stack0xffffffffffffffb8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_40 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uStack_40);
  }
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_60,(string *)&ge);
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  psVar2 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_60,this->LocalGenerator,config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_60);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallDirectoryGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)->Evaluate(this->LocalGenerator, config);
}